

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_audio.c
# Opt level: O0

void ws_audio_reset(void *info)

{
  UINT32 MuteMask;
  int local_20;
  int i;
  UINT32 muteMask;
  wsa_state *chip;
  void *info_local;
  
  MuteMask = ws_get_mute_mask(info);
  memset((void *)((long)info + 8),0,0x10);
  ws_set_mute_mask(info,MuteMask);
  *(undefined2 *)((long)info + 0x58) = 0;
  *(undefined1 *)((long)info + 0x5a) = 0;
  *(undefined1 *)((long)info + 0x60) = 0;
  *(undefined4 *)((long)info + 100) = 1;
  *(undefined2 *)((long)info + 0x68) = 2;
  *(undefined1 *)((long)info + 0x6a) = 0;
  *(undefined1 *)((long)info + 0x6b) = 0;
  RC_RESET((RATIO_CNTR *)((long)info + 0x48));
  for (local_20 = 0x80; local_20 < 0xc9; local_20 = local_20 + 1) {
    ws_audio_port_write(info,(UINT8)local_20,initialIoValue[local_20]);
  }
  return;
}

Assistant:

static void ws_audio_reset(void* info)
{
	wsa_state* chip = (wsa_state*)info;
	UINT32 muteMask;
	int i;
	
	muteMask = ws_get_mute_mask(chip);
	memset(&chip->ws_audio, 0, sizeof(WS_AUDIO));
	ws_set_mute_mask(chip, muteMask);
	
	chip->SweepTime = 0;
	chip->SweepStep = 0;
	chip->NoiseType = 0;
	chip->NoiseRng = 1;
	chip->MainVolume = 0x02;	// 0x04
	chip->PCMVolumeLeft = 0;
	chip->PCMVolumeRight = 0;
	
	RC_RESET(&chip->HBlankTmr);
	
	for (i=0x80;i<0xc9;i++)
		ws_audio_port_write(chip, i, initialIoValue[i]);
}